

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O2

ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
 __thiscall
(anonymous_namespace)::
BuildHighbdLumaParams<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,ConvolveParams*,int)>
          (_anonymous_namespace_ *this,
          _func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int
          *test_func)

{
  int iVar1;
  BlockSize BVar2;
  int iVar3;
  undefined4 uVar4;
  _anonymous_namespace_ *p_Var5;
  TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
  *__cur_1;
  ulong uVar6;
  pointer pTVar7;
  pointer pTVar8;
  _Rb_tree_node_base *p_Var9;
  undefined8 *puVar10;
  pointer pTVar11;
  undefined8 *puVar12;
  ulong uVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
  *__cur;
  pointer pTVar14;
  pointer pTVar15;
  _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
  *p_Var16;
  int b;
  long lVar17;
  long lVar18;
  _func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int *p_Var19;
  ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
  PVar20;
  _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
  local_b8;
  _func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int *local_98;
  value_type local_90;
  _anonymous_namespace_ *local_88;
  long local_80;
  BlockSize local_78;
  _Rb_tree_node_base *local_70;
  int local_68 [2];
  set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
  sizes;
  
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sizes._M_t._M_impl.super__Rb_tree_header._M_header;
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68[0] = 10;
  local_68[1] = 0xc;
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sizes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = test_func;
  for (lVar17 = 0; lVar17 != 0x16; lVar17 = lVar17 + 1) {
    local_90.width_ = (int)::block_size_wide[lVar17];
    local_90.height_ = (int)::block_size_high[lVar17];
    test_func = (_func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int
                 *)&local_90;
    std::
    set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
    ::insert(&sizes,&local_90);
  }
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar14 = (pointer)0x0;
  pTVar11 = (pointer)0x0;
  pTVar15 = (pointer)0x0;
  lVar17 = 0;
  p_Var19 = local_98;
  local_88 = this;
  do {
    if (lVar17 == 8) {
      local_b8._M_impl.super__Vector_impl_data._M_start = pTVar15;
      local_b8._M_impl.super__Vector_impl_data._M_finish = pTVar14;
      local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar11;
      std::
      set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
      ::~set(&sizes);
      puVar10 = (undefined8 *)operator_new(0x20);
      *puVar10 = &PTR__ValuesInIteratorRangeGenerator_00f3e108;
      puVar10[3] = 0;
      puVar10[1] = 0;
      puVar10[2] = 0;
      p_Var16 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                 *)(((long)pTVar14 - (long)pTVar15) / 0x18);
      if (p_Var16 < (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                     *)0x555555555555556) {
        pTVar11 = std::
                  _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                  ::_M_allocate(p_Var16,(size_t)test_func);
        p_Var5 = local_88;
        puVar10[1] = pTVar11;
        puVar10[3] = ((long)pTVar14 - (long)pTVar15) + (long)pTVar11;
        for (; pTVar15 != pTVar14; pTVar15 = pTVar15 + 1) {
          pTVar11->test_func_ = pTVar15->test_func_;
          iVar1 = pTVar15->bd_;
          uVar4 = *(undefined4 *)&pTVar15->field_0xc;
          pTVar11->block_ = pTVar15->block_;
          pTVar11->bd_ = iVar1;
          *(undefined4 *)&pTVar11->field_0xc = uVar4;
          pTVar11 = pTVar11 + 1;
        }
        puVar10[2] = pTVar11;
        *(undefined8 **)local_88 = puVar10;
        *(undefined8 *)(local_88 + 8) = 0;
        puVar12 = (undefined8 *)operator_new(0x18);
        puVar12[1] = 0x100000001;
        *puVar12 = &PTR___Sp_counted_base_00f3e1d0;
        puVar12[2] = puVar10;
        *(undefined8 **)(p_Var5 + 8) = puVar12;
        std::
        _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
        ::~_Vector_base(&local_b8);
        PVar20.impl_.
        super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = extraout_RDX._M_pi;
        PVar20.impl_.
        super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)p_Var5;
        return (ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
                )PVar20.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
      }
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    iVar1 = *(int *)((long)local_68 + lVar17);
    p_Var9 = sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_80 = lVar17;
    while ((_Rb_tree_header *)p_Var9 != &sizes._M_t._M_impl.super__Rb_tree_header) {
      BVar2.width_ = p_Var9[1]._M_color;
      BVar2.height_ = *(int *)&p_Var9[1].field_0x4;
      if (pTVar14 == pTVar11) {
        lVar18 = (long)pTVar11 - (long)pTVar15;
        if (lVar18 == 0x7ffffffffffffff8) {
          local_b8._M_impl.super__Vector_impl_data._M_start = pTVar15;
          local_b8._M_impl.super__Vector_impl_data._M_finish = pTVar14;
          local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar11;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar6 = lVar18 / 0x18;
        uVar13 = uVar6;
        if (pTVar11 == pTVar15) {
          uVar13 = 1;
        }
        p_Var16 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                   *)(uVar13 + uVar6);
        if ((_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
             *)0x555555555555554 < p_Var16) {
          p_Var16 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                     *)0x555555555555555;
        }
        if (CARRY8(uVar13,uVar6)) {
          p_Var16 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                     *)0x555555555555555;
        }
        local_78 = BVar2;
        local_70 = p_Var9;
        pTVar7 = std::
                 _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                 ::_M_allocate(p_Var16,(size_t)test_func);
        lVar17 = local_80;
        p_Var19 = local_98;
        *(BlockSize *)((long)pTVar7 + lVar18) = local_78;
        *(int *)((long)pTVar7 + lVar18 + 8) = iVar1;
        *(_func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int **
         )((long)pTVar7 + lVar18 + 0x10) = local_98;
        pTVar14 = pTVar7;
        for (pTVar8 = pTVar15; pTVar8 != pTVar11; pTVar8 = pTVar8 + 1) {
          pTVar14->test_func_ = pTVar8->test_func_;
          iVar3 = pTVar8->bd_;
          uVar4 = *(undefined4 *)&pTVar8->field_0xc;
          pTVar14->block_ = pTVar8->block_;
          pTVar14->bd_ = iVar3;
          *(undefined4 *)&pTVar14->field_0xc = uVar4;
          pTVar14 = pTVar14 + 1;
        }
        if (pTVar15 != (pointer)0x0) {
          operator_delete(pTVar15);
        }
        pTVar11 = pTVar7 + (long)p_Var16;
        p_Var9 = local_70;
      }
      else {
        pTVar14->block_ = BVar2;
        pTVar14->bd_ = iVar1;
        pTVar14->test_func_ = p_Var19;
        pTVar7 = pTVar15;
      }
      pTVar14 = pTVar14 + 1;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      pTVar15 = pTVar7;
    }
    lVar17 = lVar17 + 4;
  } while( true );
}

Assistant:

::testing::internal::ParamGenerator<TestParam<T>> BuildHighbdLumaParams(
    T test_func) {
  return ::testing::ValuesIn(GetHighbdLumaTestParams(test_func));
}